

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  undefined1 auVar1 [16];
  code *pcVar2;
  uint size;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  int iVar7;
  hash_t hVar8;
  undefined4 *puVar9;
  SimpleDictionaryEntry<unsigned_int,_unsigned_int> *dst;
  Type pSVar10;
  size_t requestedBytes;
  long lVar11;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  long lVar12;
  size_t dstCount;
  int *local_50;
  int *newBuckets;
  uint uStack_40;
  int modIndex;
  EntryType *local_38;
  EntryType *newEntries;
  
  size = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  uVar5 = 4;
  if (8 < size) {
    uVar5 = this->count & 0x7fffffff;
  }
  uVar5 = PrimePolicy::GetPrime(uVar5,(int *)((long)&newBuckets + 4));
  local_50 = (Type)0x0;
  local_38 = (SimpleDictionaryEntry<unsigned_int,_unsigned_int> *)0x0;
  if (uVar5 == this->bucketCount) {
    if (size == 0) {
      dst = (SimpleDictionaryEntry<unsigned_int,_unsigned_int> *)&DAT_00000008;
      dstCount = 0;
    }
    else {
      dstCount = (size_t)(int)size;
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dstCount;
      requestedBytes = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
        requestedBytes = SUB168(auVar1 * ZEXT816(0xc),0);
      }
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        _uStack_40 = this_00;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0082e4de;
        *puVar9 = 0;
        this_00 = _uStack_40;
      }
      if (requestedBytes == 0) {
        AssertCount = AssertCount + 1;
        _uStack_40 = this_00;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                           "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar4) goto LAB_0082e4de;
        *puVar9 = 0;
        this_00 = _uStack_40;
      }
      dst = (SimpleDictionaryEntry<unsigned_int,_unsigned_int> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
                             super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                             .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value +
                     requestedBytes),0,(requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes)
      ;
      if (dst == (SimpleDictionaryEntry<unsigned_int,_unsigned_int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_0082e4de:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar9 = 0;
        dst = (SimpleDictionaryEntry<unsigned_int,_unsigned_int> *)0x0;
      }
    }
    local_38 = dst;
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,unsigned_int>,unsigned_int,Memory::ArenaAllocator>
              (dst,dstCount,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = local_38;
    this->size = size;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_50,&local_38,uVar5,size);
    _uStack_40 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                 CONCAT44(modIndex,size);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<unsigned_int,unsigned_int>,unsigned_int,Memory::ArenaAllocator>
              (local_38,(long)(int)size,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    iVar7 = this->count;
    if (0 < iVar7) {
      lVar11 = 4;
      lVar12 = 0;
      pSVar10 = local_38;
      do {
        if (-2 < *(int *)((long)&(pSVar10->
                                 super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                 .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value +
                         lVar11)) {
          hVar8 = PrimePolicy::ModPrime
                            (*(uint *)((long)&(pSVar10->
                                              super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                              ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                              super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                              .
                                              super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                              .next + lVar11) & 0x7fffffff,uVar5,
                             this->modFunctionIndex);
          *(int *)((long)&(local_38->
                          super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          ).super_KeyValueEntry<unsigned_int,_unsigned_int>.
                          super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                          .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value + lVar11
                  ) = local_50[(int)hVar8];
          local_50[(int)hVar8] = (int)lVar12;
          iVar7 = this->count;
          pSVar10 = local_38;
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0xc;
      } while (lVar12 < iVar7);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    uVar3 = uStack_40;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,uStack_40,uStack_40 - this->size);
    }
    this->buckets = local_50;
    this->entries = local_38;
    this->bucketCount = uVar5;
    this->size = uVar3;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }